

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
header_inclusion_csv_actions::header(header_inclusion_csv_actions *this,string *header)

{
  string *header_local;
  header_inclusion_csv_actions *this_local;
  
  if ((this->first_header & 1U) == 0) {
    std::operator<<((ostream *)&std::cout,' ');
  }
  else {
    this->first_header = false;
  }
  std::operator<<((ostream *)&std::cout,(string *)header);
  return;
}

Assistant:

void header( std::string const & header )
    {
        if( first_header )
        {
            first_header = false;
        }
        else
        {
            std::cout << ' ';
        }
       
        std::cout << header;
    }